

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers_iterator.hpp
# Opt level: O0

void __thiscall
asio::buffers_iterator<asio::const_buffers_1,_char>::advance
          (buffers_iterator<asio::const_buffers_1,_char> *this,ptrdiff_t n)

{
  size_t sVar1;
  void *pvVar2;
  long in_RSI;
  const_buffer *in_RDI;
  size_t buffer_size;
  buffer_type buffer;
  buffer_sequence_iterator_type iter;
  size_t abs_n;
  ptrdiff_t current_buffer_balance;
  const_buffer local_48;
  undefined8 *local_38;
  void *local_30;
  const_buffer local_28;
  long local_18;
  long local_10;
  
  local_10 = in_RSI;
  if (in_RSI < 1) {
    if (in_RSI < 0) {
      local_30 = (void *)-in_RSI;
LAB_003a7356:
      if (in_RDI[1].data_ < local_30) {
        local_30 = (void *)((long)local_30 - (long)in_RDI[1].data_);
        in_RDI[3].data_ = (void *)((long)in_RDI[3].data_ - (long)in_RDI[1].data_);
        if (in_RDI[2].data_ == (void *)in_RDI[1].size_) {
          in_RDI[1].data_ = (void *)0x0;
          return;
        }
        local_38 = (undefined8 *)in_RDI[2].data_;
        do {
          if (local_38 == (undefined8 *)in_RDI[1].size_) goto LAB_003a7356;
          local_48.data_ = (void *)local_38[-2];
          local_48.size_ = local_38[-1];
          local_38 = local_38 + -2;
          pvVar2 = (void *)const_buffer::size(&local_48);
        } while (pvVar2 == (void *)0x0);
        in_RDI[2].data_ = local_38;
        in_RDI->data_ = local_48.data_;
        in_RDI->size_ = local_48.size_;
        in_RDI[1].data_ = pvVar2;
        goto LAB_003a7356;
      }
      in_RDI[3].data_ = (void *)((long)in_RDI[3].data_ - (long)local_30);
      in_RDI[1].data_ = (void *)((long)in_RDI[1].data_ - (long)local_30);
    }
  }
  else {
    while( true ) {
      sVar1 = const_buffer::size(in_RDI);
      local_18 = sVar1 - (long)in_RDI[1].data_;
      if (local_10 < local_18) break;
      local_10 = local_10 - local_18;
      in_RDI[3].data_ = (void *)(local_18 + (long)in_RDI[3].data_);
      pvVar2 = (void *)((long)in_RDI[2].data_ + 0x10);
      in_RDI[2].data_ = pvVar2;
      if (pvVar2 == (void *)in_RDI[2].size_) {
        const_buffer::const_buffer(&local_28);
        in_RDI->data_ = local_28.data_;
        in_RDI->size_ = local_28.size_;
        in_RDI[1].data_ = (void *)0x0;
        return;
      }
      in_RDI->data_ = *in_RDI[2].data_;
      in_RDI->size_ = *(size_t *)((long)in_RDI[2].data_ + 8);
      in_RDI[1].data_ = (void *)0x0;
    }
    in_RDI[3].data_ = (void *)(local_10 + (long)in_RDI[3].data_);
    in_RDI[1].data_ = (void *)(local_10 + (long)in_RDI[1].data_);
  }
  return;
}

Assistant:

void advance(std::ptrdiff_t n)
  {
    if (n > 0)
    {
      ASIO_ASSERT(current_ != end_ && "iterator out of bounds");
      for (;;)
      {
        std::ptrdiff_t current_buffer_balance
          = current_buffer_.size() - current_buffer_position_;

        // Check if the advance can be satisfied by the current buffer.
        if (current_buffer_balance > n)
        {
          position_ += n;
          current_buffer_position_ += n;
          return;
        }

        // Update position.
        n -= current_buffer_balance;
        position_ += current_buffer_balance;

        // Move to next buffer. If it is empty then it will be skipped on the
        // next iteration of this loop.
        if (++current_ == end_)
        {
          ASIO_ASSERT(n == 0 && "iterator out of bounds");
          current_buffer_ = buffer_type();
          current_buffer_position_ = 0;
          return;
        }
        current_buffer_ = *current_;
        current_buffer_position_ = 0;
      }
    }
    else if (n < 0)
    {
      std::size_t abs_n = -n;
      ASIO_ASSERT(position_ >= abs_n && "iterator out of bounds");
      for (;;)
      {
        // Check if the advance can be satisfied by the current buffer.
        if (current_buffer_position_ >= abs_n)
        {
          position_ -= abs_n;
          current_buffer_position_ -= abs_n;
          return;
        }

        // Update position.
        abs_n -= current_buffer_position_;
        position_ -= current_buffer_position_;

        // Check if we've reached the beginning of the buffers.
        if (current_ == begin_)
        {
          ASIO_ASSERT(abs_n == 0 && "iterator out of bounds");
          current_buffer_position_ = 0;
          return;
        }

        // Find the previous non-empty buffer.
        buffer_sequence_iterator_type iter = current_;
        while (iter != begin_)
        {
          --iter;
          buffer_type buffer = *iter;
          std::size_t buffer_size = buffer.size();
          if (buffer_size > 0)
          {
            current_ = iter;
            current_buffer_ = buffer;
            current_buffer_position_ = buffer_size;
            break;
          }
        }
      }
    }
  }